

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

undefined8 __thiscall
StringInstance::op_substringFromIndex_toIndex
          (StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  undefined8 *puVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  int to_index;
  int from_index;
  int iVar7;
  string local_148 [16];
  string *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  char in_stack_fffffffffffffed7;
  string *in_stack_fffffffffffffed8;
  string local_108 [32];
  IntegerInstance local_e8;
  int local_84;
  IntegerInstance local_80;
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar5 != 2) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar6,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  IntegerInstance::IntegerInstance
            ((IntegerInstance *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
  iVar1 = IntegerInstance::value(&local_80);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1bc7e2);
  local_1c = iVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,1);
  IntegerInstance::IntegerInstance
            ((IntegerInstance *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
  iVar2 = IntegerInstance::value(&local_e8);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1bc82d);
  local_84 = iVar2;
  if (-1 < local_1c) {
    iVar7 = local_1c;
    iVar3 = std::__cxx11::string::size();
    if (iVar7 <= iVar3) {
      if (-1 < local_84) {
        iVar3 = local_84;
        iVar4 = std::__cxx11::string::size();
        if (iVar3 <= iVar4) {
          if (local_84 - local_1c < 0) {
            puVar6 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar6 = "RuntimeError: invalid argument.";
            __cxa_throw(puVar6,&char_const*::typeinfo,0);
          }
          std::__cxx11::string::substr((ulong)local_148,in_RSI + 0x58);
          str_utils::escape(in_stack_fffffffffffffed8,in_stack_fffffffffffffed7);
          std::operator+((char *)CONCAT44(iVar2,iVar1),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(iVar7,iVar3));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(iVar2,iVar1),(char *)CONCAT44(iVar7,iVar3));
          std::__cxx11::string::~string(local_108);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
          std::__cxx11::string::~string(local_148);
          return in_RDI;
        }
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = "RuntimeError: invalid argument.";
      __cxa_throw(puVar6,&char_const*::typeinfo,0);
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_substringFromIndex_toIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int from_index = IntegerInstance(arguments[0]).value();
    int to_index = IntegerInstance(arguments[1]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    if (to_index < 0 || to_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    if (to_index - from_index < 0)
        throw EXC_INVALID_ARGUMENT;
    return "\"" + str_utils::escape(_value.substr(from_index, to_index - from_index), '"') + "\"";
}